

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cpp.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerCPP::emit_shared(CompilerCPP *this,SPIRVariable *var)

{
  uint32_t uVar1;
  undefined1 local_58 [40];
  string instance_name;
  SPIRVariable *var_local;
  CompilerCPP *this_local;
  
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
  CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,uVar1);
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
            (local_58 + 0x20,this,(ulong)uVar1,1);
  CompilerGLSL::variable_decl_abi_cxx11_((CompilerGLSL *)local_58,(SPIRVariable *)this);
  CompilerGLSL::statement<std::__cxx11::string,char_const(&)[2]>
            (&this->super_CompilerGLSL,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
             (char (*) [2])0x4d9ce2);
  ::std::__cxx11::string::~string((string *)local_58);
  CompilerGLSL::
  statement_no_indent<char_const(&)[9],std::__cxx11::string&,char_const(&)[9],std::__cxx11::string&>
            (&this->super_CompilerGLSL,(char (*) [9])"#define ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_58 + 0x20),
             (char (*) [9])" __res->",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_58 + 0x20))
  ;
  ::std::__cxx11::string::~string((string *)(local_58 + 0x20));
  return;
}

Assistant:

void CompilerCPP::emit_shared(const SPIRVariable &var)
{
	add_resource_name(var.self);

	auto instance_name = to_name(var.self);
	statement(CompilerGLSL::variable_decl(var), ";");
	statement_no_indent("#define ", instance_name, " __res->", instance_name);
}